

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSignal.h
# Opt level: O0

CollectorResult __thiscall
Simple::Lib::ProtoSignal<bool_(),_Simple::CollectorWhile0<bool>_>::emit
          (ProtoSignal<bool_(),_Simple::CollectorWhile0<bool>_> *this)

{
  byte bVar1;
  SignalLink *this_00;
  bool bVar2;
  CollectorResult_conflict *pCVar3;
  SignalLink *old;
  SignalLink *pSStack_28;
  bool continue_emission;
  SignalLink *link;
  ProtoSignal<bool_(),_Simple::CollectorWhile0<bool>_> *pPStack_18;
  CollectorWhile0<bool> collector;
  ProtoSignal<bool_(),_Simple::CollectorWhile0<bool>_> *this_local;
  
  pPStack_18 = this;
  CollectorWhile0<bool>::CollectorWhile0((CollectorWhile0<bool> *)((long)&link + 7));
  if (this->callback_ring_ == (SignalLink *)0x0) {
    pCVar3 = CollectorWhile0<bool>::result((CollectorWhile0<bool> *)((long)&link + 7));
    bVar1 = *pCVar3;
  }
  else {
    pSStack_28 = this->callback_ring_;
    SignalLink::incref(pSStack_28);
    do {
      bVar2 = std::operator!=(&pSStack_28->function,(nullptr_t)0x0);
      if ((bVar2) &&
         (bVar2 = CollectorInvocation<Simple::CollectorWhile0<bool>,_bool_()>::invoke
                            ((CollectorInvocation<Simple::CollectorWhile0<bool>,_bool_()> *)this,
                             (CollectorWhile0<bool> *)((long)&link + 7),&pSStack_28->function),
         !bVar2)) break;
      this_00 = pSStack_28->next;
      SignalLink::incref(this_00);
      SignalLink::decref(pSStack_28);
      pSStack_28 = this_00;
    } while (this_00 != this->callback_ring_);
    SignalLink::decref(pSStack_28);
    pCVar3 = CollectorWhile0<bool>::result((CollectorWhile0<bool> *)((long)&link + 7));
    bVar1 = *pCVar3;
  }
  this_local._7_1_ = (CollectorResult)(bVar1 & 1);
  return this_local._7_1_;
}

Assistant:

CollectorResult
  emit (Args... args)
  {
    Collector collector;
    if (!callback_ring_)
      return collector.result();
    SignalLink *link = callback_ring_;
    link->incref();
    do
      {
        if (link->function != nullptr)
          {
            const bool continue_emission = this->invoke (collector, link->function, args...);
            if (!continue_emission)
              break;
          }
        SignalLink *old = link;
        link = old->next;
        link->incref();
        old->decref();
      }
    while (link != callback_ring_);
    link->decref();
    return collector.result();
  }